

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O2

void __thiscall Fifteen::setColor(Fifteen *this)

{
  pointer puVar1;
  qsizetype qVar2;
  vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
  *pvVar3;
  unique_ptr<QPushButton,_std::default_delete<QPushButton>_> *tile;
  pointer puVar4;
  QArrayDataPointer<char16_t> local_40;
  
  Options::getTileColor();
  pvVar3 = TilesBoard::getTiles
                     ((this->tilesBoard)._M_t.
                      super___uniq_ptr_impl<TilesBoard,_std::default_delete<TilesBoard>_>._M_t.
                      super__Tuple_impl<0UL,_TilesBoard_*,_std::default_delete<TilesBoard>_>.
                      super__Head_base<0UL,_TilesBoard_*,_false>._M_head_impl);
  puVar1 = (pvVar3->
           super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (pvVar3->
                super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    QAbstractButton::text();
    qVar2 = local_40.size;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_40);
    if (qVar2 != 0) {
      QWidget::setStyleSheet
                ((QString *)
                 (puVar4->_M_t).
                 super___uniq_ptr_impl<QPushButton,_std::default_delete<QPushButton>_>._M_t.
                 super__Tuple_impl<0UL,_QPushButton_*,_std::default_delete<QPushButton>_>.
                 super__Head_base<0UL,_QPushButton_*,_false>._M_head_impl);
    }
  }
  return;
}

Assistant:

void Fifteen::setColor()
{
    auto& tileColor = Options::getTileColor();

    for ( auto& tile : tilesBoard->getTiles() )
    {
        if ( tile->text() != nullptr )
        {
            tile->setStyleSheet( tileColor );
        }
    }    
}